

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InstrumentPass::MovePreludeCode
          (InstrumentPass *this,iterator *ref_inst_itr,
          UptrVectorIterator<spvtools::opt::BasicBlock,_false> ref_block_itr,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr)

{
  BasicBlock *pBVar1;
  Instruction *this_00;
  BasicBlock *this_01;
  mapped_type *ppIVar2;
  Instruction *inst;
  uint32_t local_3c;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_38;
  
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->same_block_pre_)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->same_block_post_)._M_h);
  this_01 = (BasicBlock *)operator_new(0x88);
  pBVar1 = ((ref_block_itr.iterator_._M_current._M_current)->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  local_38._M_head_impl =
       *(Instruction **)
        &(pBVar1->label_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ;
  (pBVar1->label_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          )0x0;
  BasicBlock::BasicBlock
            (this_01,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_38);
  std::__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  reset((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         *)new_blk_ptr,this_01);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*((local_38._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  local_38._M_head_impl = (Instruction *)0x0;
  while (this_00 = ((((ref_block_itr.iterator_._M_current._M_current)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->
                   insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
        this_00 != (ref_inst_itr->super_iterator).node_) {
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
              (&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    if ((this_00->opcode_ == OpImage) || (this_00->opcode_ == OpSampledImage)) {
      local_3c = Instruction::result_id(this_00);
      ppIVar2 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->same_block_pre_,&local_3c);
      *ppIVar2 = this_00;
    }
    utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
              (&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
               &(((new_blk_ptr->_M_t).
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->insts_).
                super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
  }
  return;
}

Assistant:

void InstrumentPass::MovePreludeCode(
    BasicBlock::iterator ref_inst_itr,
    UptrVectorIterator<BasicBlock> ref_block_itr,
    std::unique_ptr<BasicBlock>* new_blk_ptr) {
  same_block_pre_.clear();
  same_block_post_.clear();
  // Initialize new block. Reuse label from original block.
  new_blk_ptr->reset(new BasicBlock(std::move(ref_block_itr->GetLabel())));
  // Move contents of original ref block up to ref instruction.
  for (auto cii = ref_block_itr->begin(); cii != ref_inst_itr;
       cii = ref_block_itr->begin()) {
    Instruction* inst = &*cii;
    inst->RemoveFromList();
    std::unique_ptr<Instruction> mv_ptr(inst);
    // Remember same-block ops for possible regeneration.
    if (IsSameBlockOp(&*mv_ptr)) {
      auto* sb_inst_ptr = mv_ptr.get();
      same_block_pre_[mv_ptr->result_id()] = sb_inst_ptr;
    }
    (*new_blk_ptr)->AddInstruction(std::move(mv_ptr));
  }
}